

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O0

void __thiscall wasm::OptimizationOptions::addDefaultOptPasses(OptimizationOptions *this)

{
  allocator<char> local_61;
  string local_60;
  PassInfo local_40;
  OptimizationOptions *local_10;
  OptimizationOptions *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"O",&local_61);
  PassInfo::PassInfo(&local_40,&local_60,(this->super_ToolOptions).passOptions.optimizeLevel,
                     (this->super_ToolOptions).passOptions.shrinkLevel);
  std::
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ::push_back(&this->passes,&local_40);
  PassInfo::~PassInfo(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void addDefaultOptPasses() {
    passes.push_back(PassInfo{
      DEFAULT_OPT_PASSES, passOptions.optimizeLevel, passOptions.shrinkLevel});
  }